

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

Instr * __thiscall FlowGraph::PeepTypedCm(FlowGraph *this,Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  Instr *pIVar5;
  undefined4 *puVar6;
  Opnd *pOVar7;
  Opnd *pOVar8;
  RegOpnd *dstOpnd;
  Instr *this_00;
  IntConstOpnd *pIVar9;
  BranchInstr *this_01;
  OpCode local_6a;
  OpCode newOpcode;
  Opnd *tmpOpnd;
  Instr *instrNew;
  Opnd *src2;
  Opnd *src1;
  bool brIsTrue;
  Instr *instrBr;
  Instr *instrLd2;
  Instr *instrLd;
  Instr *instrNext;
  Instr *instr_local;
  FlowGraph *this_local;
  
  pIVar5 = IR::Instr::GetNextRealInstrOrLabel(instr);
  instrLd2 = (Instr *)0x0;
  instrLd = pIVar5;
  if (pIVar5->m_opcode == Ld_I4) {
    instrLd = IR::Instr::GetNextRealInstrOrLabel(pIVar5);
    instrLd2 = pIVar5;
  }
  instrBr = (Instr *)0x0;
  if (instrLd->m_opcode == Ld_I4) {
    instrBr = instrLd;
    instrLd = IR::Instr::GetNextRealInstrOrLabel(instrLd);
  }
  if (instrLd->m_opcode == BrTrue_I4) {
    bVar3 = true;
  }
  else {
    if (instrLd->m_opcode != BrFalse_I4) {
      return (Instr *)0x0;
    }
    bVar3 = false;
  }
  if ((instrLd2 == (Instr *)0x0) && (instrBr != (Instr *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x9cb,"(instrLd || (!instrLd && !instrLd2))",
                       "Either instrLd is non-null or both null");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (instrLd2 != (Instr *)0x0) {
    pOVar7 = IR::Instr::GetSrc1(instrLd2);
    pOVar8 = IR::Instr::GetDst(instr);
    bVar4 = IR::Opnd::IsEqual(pOVar7,pOVar8);
    if (!bVar4) {
      return (Instr *)0x0;
    }
  }
  if (instrBr != (Instr *)0x0) {
    pOVar7 = IR::Instr::GetSrc1(instrBr);
    pOVar8 = IR::Instr::GetDst(instrLd2);
    bVar4 = IR::Opnd::IsEqual(pOVar7,pOVar8);
    if (!bVar4) {
      return (Instr *)0x0;
    }
  }
  pOVar7 = IR::Instr::GetDst(instr);
  pOVar8 = IR::Instr::GetSrc1(instrLd);
  bVar4 = IR::Opnd::IsEqual(pOVar7,pOVar8);
  if (!bVar4) {
    if (instrLd2 != (Instr *)0x0) {
      pOVar7 = IR::Instr::GetDst(instrLd2);
      pOVar8 = IR::Instr::GetSrc1(instrLd);
      bVar4 = IR::Opnd::IsEqual(pOVar7,pOVar8);
      if (bVar4) goto LAB_005309a6;
    }
    if (instrBr == (Instr *)0x0) {
      return (Instr *)0x0;
    }
    pOVar7 = IR::Instr::GetDst(instrBr);
    pOVar8 = IR::Instr::GetSrc1(instrLd);
    bVar4 = IR::Opnd::IsEqual(pOVar7,pOVar8);
    if (!bVar4) {
      return (Instr *)0x0;
    }
  }
LAB_005309a6:
  src2 = IR::Instr::UnlinkSrc1(instr);
  instrNew = (Instr *)IR::Instr::UnlinkSrc2(instr);
  pOVar7 = IR::Instr::GetDst(instr);
  bVar4 = IR::Opnd::IsEqual(pOVar7,src2);
  if (bVar4) {
LAB_00530a22:
    bVar4 = IR::Opnd::IsInt32(src2);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x9ea,"(src1->IsInt32())","src1->IsInt32()");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    dstOpnd = IR::RegOpnd::New(TyInt32,instr->m_func);
    pIVar5 = IR::Instr::New(Ld_I4,&dstOpnd->super_Opnd,src2,instr->m_func);
    IR::Instr::SetByteCodeOffset(pIVar5,instr);
    IR::Instr::InsertBefore(instr,pIVar5);
    src2 = &dstOpnd->super_Opnd;
  }
  else {
    if (instrLd2 != (Instr *)0x0) {
      pOVar7 = IR::Instr::GetDst(instrLd2);
      bVar4 = IR::Opnd::IsEqual(pOVar7,src2);
      if (bVar4) goto LAB_00530a22;
    }
    if (instrBr != (Instr *)0x0) {
      pOVar7 = IR::Instr::GetDst(instrBr);
      bVar4 = IR::Opnd::IsEqual(pOVar7,src2);
      if (bVar4) goto LAB_00530a22;
    }
  }
  pOVar7 = IR::Instr::GetDst(instr);
  bVar4 = IR::Opnd::IsEqual(pOVar7,(Opnd *)instrNew);
  if (!bVar4) {
    if (instrLd2 != (Instr *)0x0) {
      pOVar7 = IR::Instr::GetDst(instrLd2);
      bVar4 = IR::Opnd::IsEqual(pOVar7,(Opnd *)instrNew);
      if (bVar4) goto LAB_00530b56;
    }
    if (instrBr == (Instr *)0x0) goto LAB_00530c28;
    pOVar7 = IR::Instr::GetDst(instrBr);
    bVar4 = IR::Opnd::IsEqual(pOVar7,(Opnd *)instrNew);
    if (!bVar4) goto LAB_00530c28;
  }
LAB_00530b56:
  bVar4 = IR::Opnd::IsInt32((Opnd *)instrNew);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x9f5,"(src2->IsInt32())","src2->IsInt32()");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pIVar5 = (Instr *)IR::RegOpnd::New(TyInt32,instr->m_func);
  this_00 = IR::Instr::New(Ld_I4,(Opnd *)pIVar5,(Opnd *)instrNew,instr->m_func);
  IR::Instr::SetByteCodeOffset(this_00,instr);
  IR::Instr::InsertBefore(instr,this_00);
  instrNew = pIVar5;
LAB_00530c28:
  IR::Instr::ReplaceSrc1(instrLd,src2);
  IR::Instr::SetSrc2(instrLd,(Opnd *)instrNew);
  OVar1 = instr->m_opcode;
  if (OVar1 == CmEq_A) {
    local_6a = BrEq_A;
  }
  else if (OVar1 == CmGe_A) {
    local_6a = BrGe_A;
  }
  else if (OVar1 == CmGt_A) {
    local_6a = BrGt_A;
  }
  else if (OVar1 == CmLt_A) {
    local_6a = BrLt_A;
  }
  else if (OVar1 == CmLe_A) {
    local_6a = BrLe_A;
  }
  else if (OVar1 == CmNeq_A) {
    local_6a = BrNeq_A;
  }
  else if (OVar1 == CmSrEq_A) {
    local_6a = BrSrEq_A;
  }
  else if (OVar1 == CmSrNeq_A) {
    local_6a = BrSrNeq_A;
  }
  else if (OVar1 == CmUnGe_A) {
    local_6a = BrUnGe_A;
  }
  else if (OVar1 == CmUnGt_A) {
    local_6a = BrUnGt_A;
  }
  else if (OVar1 == CmUnLt_A) {
    local_6a = BrUnLt_A;
  }
  else if (OVar1 == CmUnLe_A) {
    local_6a = BrUnLe_A;
  }
  else if (OVar1 == CmEq_I4) {
    local_6a = BrEq_I4;
  }
  else if (OVar1 == CmNeq_I4) {
    local_6a = BrNeq_I4;
  }
  else if (OVar1 == CmLt_I4) {
    local_6a = BrLt_I4;
  }
  else if (OVar1 == CmLe_I4) {
    local_6a = BrLe_I4;
  }
  else if (OVar1 == CmGt_I4) {
    local_6a = BrGt_I4;
  }
  else if (OVar1 == CmGe_I4) {
    local_6a = BrGe_I4;
  }
  else if (OVar1 == CmUnLt_I4) {
    local_6a = BrUnLt_I4;
  }
  else if (OVar1 == CmUnLe_I4) {
    local_6a = BrUnLe_I4;
  }
  else if (OVar1 == CmUnGt_I4) {
    local_6a = BrUnGt_I4;
  }
  else if (OVar1 == CmUnGe_I4) {
    local_6a = BrUnGe_I4;
  }
  else {
    local_6a = InvalidOpCode;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xa48,"((0))","(0)");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  instrLd->m_opcode = local_6a;
  if (bVar3) {
    pIVar9 = IR::IntConstOpnd::New(1,TyInt8,instr->m_func,false);
    IR::Instr::SetSrc1(instr,&pIVar9->super_Opnd);
    instr->m_opcode = Ld_I4;
    pOVar7 = IR::Instr::GetDst(instr);
    pIVar9 = IR::IntConstOpnd::New(0,TyInt8,instr->m_func,false);
    pIVar5 = IR::Instr::New(Ld_I4,pOVar7,&pIVar9->super_Opnd,instr->m_func);
    IR::Instr::SetByteCodeOffset(pIVar5,instrLd);
    IR::Instr::InsertAfter(instrLd,pIVar5);
    if (instrLd2 != (Instr *)0x0) {
      pIVar9 = IR::IntConstOpnd::New(1,TyInt8,instr->m_func,false);
      IR::Instr::ReplaceSrc1(instrLd2,&pIVar9->super_Opnd);
      pOVar7 = IR::Instr::GetDst(instrLd2);
      pIVar9 = IR::IntConstOpnd::New(0,TyInt8,instr->m_func,false);
      pIVar5 = IR::Instr::New(Ld_I4,pOVar7,&pIVar9->super_Opnd,instr->m_func);
      IR::Instr::SetByteCodeOffset(pIVar5,instrLd);
      IR::Instr::InsertAfter(instrLd,pIVar5);
      if (instrBr != (Instr *)0x0) {
        pIVar9 = IR::IntConstOpnd::New(1,TyInt8,instr->m_func,false);
        IR::Instr::ReplaceSrc1(instrBr,&pIVar9->super_Opnd);
        pOVar7 = IR::Instr::GetDst(instrBr);
        pIVar9 = IR::IntConstOpnd::New(0,TyInt8,instr->m_func,false);
        pIVar5 = IR::Instr::New(Ld_I4,pOVar7,&pIVar9->super_Opnd,instr->m_func);
        IR::Instr::SetByteCodeOffset(pIVar5,instrLd);
        IR::Instr::InsertAfter(instrLd,pIVar5);
      }
    }
  }
  else {
    this_01 = IR::Instr::AsBranchInstr(instrLd);
    IR::BranchInstr::Invert(this_01);
    pIVar9 = IR::IntConstOpnd::New(0,TyInt8,instr->m_func,false);
    IR::Instr::SetSrc1(instr,&pIVar9->super_Opnd);
    instr->m_opcode = Ld_I4;
    pOVar7 = IR::Instr::GetDst(instr);
    pIVar9 = IR::IntConstOpnd::New(1,TyInt8,instr->m_func,false);
    pIVar5 = IR::Instr::New(Ld_I4,pOVar7,&pIVar9->super_Opnd,instr->m_func);
    IR::Instr::SetByteCodeOffset(pIVar5,instrLd);
    IR::Instr::InsertAfter(instrLd,pIVar5);
    if (instrLd2 != (Instr *)0x0) {
      pIVar9 = IR::IntConstOpnd::New(0,TyInt8,instr->m_func,false);
      IR::Instr::ReplaceSrc1(instrLd2,&pIVar9->super_Opnd);
      pOVar7 = IR::Instr::GetDst(instrLd2);
      pIVar9 = IR::IntConstOpnd::New(1,TyInt8,instr->m_func,false);
      pIVar5 = IR::Instr::New(Ld_I4,pOVar7,&pIVar9->super_Opnd,instr->m_func);
      IR::Instr::SetByteCodeOffset(pIVar5,instrLd);
      IR::Instr::InsertAfter(instrLd,pIVar5);
      if (instrBr != (Instr *)0x0) {
        pIVar9 = IR::IntConstOpnd::New(0,TyInt8,instr->m_func,false);
        IR::Instr::ReplaceSrc1(instrBr,&pIVar9->super_Opnd);
        pOVar7 = IR::Instr::GetDst(instrBr);
        pIVar9 = IR::IntConstOpnd::New(1,TyInt8,instr->m_func,false);
        pIVar5 = IR::Instr::New(Ld_I4,pOVar7,&pIVar9->super_Opnd,instr->m_func);
        IR::Instr::SetByteCodeOffset(pIVar5,instrLd);
        IR::Instr::InsertAfter(instrLd,pIVar5);
      }
    }
  }
  return instrLd;
}

Assistant:

IR::Instr *
FlowGraph::PeepTypedCm(IR::Instr *instr)
{
    // Basic pattern, peep:
    //      t1 = CmEq a, b
    //      BrTrue_I4 $L1, t1
    // Into:
    //      t1 = 1
    //      BrEq $L1, a, b
    //      t1 = 0

    IR::Instr * instrNext = instr->GetNextRealInstrOrLabel();

    // find intermediate Lds
    IR::Instr * instrLd = nullptr;
    if (instrNext->m_opcode == Js::OpCode::Ld_I4)
    {
        instrLd = instrNext;
        instrNext = instrNext->GetNextRealInstrOrLabel();
    }

    IR::Instr * instrLd2 = nullptr;
    if (instrNext->m_opcode == Js::OpCode::Ld_I4)
    {
        instrLd2 = instrNext;
        instrNext = instrNext->GetNextRealInstrOrLabel();
    }

    // Find BrTrue/BrFalse
    IR::Instr *instrBr;
    bool brIsTrue;
    if (instrNext->m_opcode == Js::OpCode::BrTrue_I4)
    {
        instrBr = instrNext;
        brIsTrue = true;
    }
    else if (instrNext->m_opcode == Js::OpCode::BrFalse_I4)
    {
        instrBr = instrNext;
        brIsTrue = false;
    }
    else
    {
        return nullptr;
    }

    AssertMsg(instrLd || (!instrLd && !instrLd2), "Either instrLd is non-null or both null");

    // if we have intermediate Lds, then make sure pattern is:
    //      t1 = CmEq a, b
    //      t2 = Ld_A t1
    //      BrTrue $L1, t2
    if (instrLd && !instrLd->GetSrc1()->IsEqual(instr->GetDst()))
    {
        return nullptr;
    }

    if (instrLd2 && !instrLd2->GetSrc1()->IsEqual(instrLd->GetDst()))
    {
        return nullptr;
    }

    // Make sure we have:
    //      t1 = CmEq a, b
    //           BrTrue/BrFalse t1
    if (!(instr->GetDst()->IsEqual(instrBr->GetSrc1()) || (instrLd && instrLd->GetDst()->IsEqual(instrBr->GetSrc1())) || (instrLd2 && instrLd2->GetDst()->IsEqual(instrBr->GetSrc1()))))
    {
        return nullptr;
    }

    IR::Opnd * src1 = instr->UnlinkSrc1();
    IR::Opnd * src2 = instr->UnlinkSrc2();

    IR::Instr * instrNew;
    IR::Opnd * tmpOpnd;
    if (instr->GetDst()->IsEqual(src1) || (instrLd && instrLd->GetDst()->IsEqual(src1)) || (instrLd2 && instrLd2->GetDst()->IsEqual(src1)))
    {
        Assert(src1->IsInt32());

        tmpOpnd = IR::RegOpnd::New(TyInt32, instr->m_func);
        instrNew = IR::Instr::New(Js::OpCode::Ld_I4, tmpOpnd, src1, instr->m_func);
        instrNew->SetByteCodeOffset(instr);
        instr->InsertBefore(instrNew);
        src1 = tmpOpnd;
    }

    if (instr->GetDst()->IsEqual(src2) || (instrLd && instrLd->GetDst()->IsEqual(src2)) || (instrLd2 && instrLd2->GetDst()->IsEqual(src2)))
    {
        Assert(src2->IsInt32());

        tmpOpnd = IR::RegOpnd::New(TyInt32, instr->m_func);
        instrNew = IR::Instr::New(Js::OpCode::Ld_I4, tmpOpnd, src2, instr->m_func);
        instrNew->SetByteCodeOffset(instr);
        instr->InsertBefore(instrNew);
        src2 = tmpOpnd;
    }

    instrBr->ReplaceSrc1(src1);
    instrBr->SetSrc2(src2);

    Js::OpCode newOpcode;
    switch (instr->m_opcode)
    {
    case Js::OpCode::CmEq_I4:
        newOpcode = Js::OpCode::BrEq_I4;
        break;
    case Js::OpCode::CmGe_I4:
        newOpcode = Js::OpCode::BrGe_I4;
        break;
    case Js::OpCode::CmGt_I4:
        newOpcode = Js::OpCode::BrGt_I4;
        break;
    case Js::OpCode::CmLt_I4:
        newOpcode = Js::OpCode::BrLt_I4;
        break;
    case Js::OpCode::CmLe_I4:
        newOpcode = Js::OpCode::BrLe_I4;
        break;
    case Js::OpCode::CmUnGe_I4:
        newOpcode = Js::OpCode::BrUnGe_I4;
        break;
    case Js::OpCode::CmUnGt_I4:
        newOpcode = Js::OpCode::BrUnGt_I4;
        break;
    case Js::OpCode::CmUnLt_I4:
        newOpcode = Js::OpCode::BrUnLt_I4;
        break;
    case Js::OpCode::CmUnLe_I4:
        newOpcode = Js::OpCode::BrUnLe_I4;
        break;
    case Js::OpCode::CmNeq_I4:
        newOpcode = Js::OpCode::BrNeq_I4;
        break;
    case Js::OpCode::CmEq_A:
        newOpcode = Js::OpCode::BrEq_A;
        break;
    case Js::OpCode::CmGe_A:
        newOpcode = Js::OpCode::BrGe_A;
        break;
    case Js::OpCode::CmGt_A:
        newOpcode = Js::OpCode::BrGt_A;
        break;
    case Js::OpCode::CmLt_A:
        newOpcode = Js::OpCode::BrLt_A;
        break;
    case Js::OpCode::CmLe_A:
        newOpcode = Js::OpCode::BrLe_A;
        break;
    case Js::OpCode::CmUnGe_A:
        newOpcode = Js::OpCode::BrUnGe_A;
        break;
    case Js::OpCode::CmUnGt_A:
        newOpcode = Js::OpCode::BrUnGt_A;
        break;
    case Js::OpCode::CmUnLt_A:
        newOpcode = Js::OpCode::BrUnLt_A;
        break;
    case Js::OpCode::CmUnLe_A:
        newOpcode = Js::OpCode::BrUnLe_A;
        break;
    case Js::OpCode::CmNeq_A:
        newOpcode = Js::OpCode::BrNeq_A;
        break;
    case Js::OpCode::CmSrEq_A:
        newOpcode = Js::OpCode::BrSrEq_A;
        break;
    case Js::OpCode::CmSrNeq_A:
        newOpcode = Js::OpCode::BrSrNeq_A;
        break;
    default:
        newOpcode = Js::OpCode::InvalidOpCode;
        Assume(UNREACHED);
    }

    instrBr->m_opcode = newOpcode;

    if (brIsTrue)
    {
        instr->SetSrc1(IR::IntConstOpnd::New(1, TyInt8, instr->m_func));
        instr->m_opcode = Js::OpCode::Ld_I4;
        instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instr->GetDst(), IR::IntConstOpnd::New(0, TyInt8, instr->m_func), instr->m_func);
        instrNew->SetByteCodeOffset(instrBr);
        instrBr->InsertAfter(instrNew);
        if (instrLd)
        {
            instrLd->ReplaceSrc1(IR::IntConstOpnd::New(1, TyInt8, instr->m_func));
            instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instrLd->GetDst(), IR::IntConstOpnd::New(0, TyInt8, instr->m_func), instr->m_func);
            instrNew->SetByteCodeOffset(instrBr);
            instrBr->InsertAfter(instrNew);

            if (instrLd2)
            {
                instrLd2->ReplaceSrc1(IR::IntConstOpnd::New(1, TyInt8, instr->m_func));
                instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instrLd2->GetDst(), IR::IntConstOpnd::New(0, TyInt8, instr->m_func), instr->m_func);
                instrNew->SetByteCodeOffset(instrBr);
                instrBr->InsertAfter(instrNew);
            }
        }
    }
    else
    {
        instrBr->AsBranchInstr()->Invert();

        instr->SetSrc1(IR::IntConstOpnd::New(0, TyInt8, instr->m_func));
        instr->m_opcode = Js::OpCode::Ld_I4;
        instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instr->GetDst(), IR::IntConstOpnd::New(1, TyInt8, instr->m_func), instr->m_func);
        instrNew->SetByteCodeOffset(instrBr);
        instrBr->InsertAfter(instrNew);
        if (instrLd)
        {
            instrLd->ReplaceSrc1(IR::IntConstOpnd::New(0, TyInt8, instr->m_func));
            instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instrLd->GetDst(), IR::IntConstOpnd::New(1, TyInt8, instr->m_func), instr->m_func);
            instrNew->SetByteCodeOffset(instrBr);
            instrBr->InsertAfter(instrNew);

            if (instrLd2)
            {
                instrLd2->ReplaceSrc1(IR::IntConstOpnd::New(0, TyInt8, instr->m_func));
                instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instrLd2->GetDst(), IR::IntConstOpnd::New(1, TyInt8, instr->m_func), instr->m_func);
                instrNew->SetByteCodeOffset(instrBr);
                instrBr->InsertAfter(instrNew);
            }
        }
    }

    return instrBr;
}